

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall
Json::BuiltStyledStreamWriter::isMultineArray(BuiltStyledStreamWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  int iVar4;
  Value *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long in_RDI;
  ArrayIndex index_1;
  ArrayIndex lineLength;
  Value *childValue;
  ArrayIndex index;
  bool isMultiLine;
  ArrayIndex size;
  ArrayIndex in_stack_000001c4;
  Value *in_stack_000001c8;
  Value *in_stack_000001e8;
  BuiltStyledStreamWriter *in_stack_000001f0;
  undefined5 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc5;
  undefined1 in_stack_ffffffffffffffc6;
  byte bVar5;
  undefined4 local_30;
  undefined4 local_2c;
  Value *in_stack_ffffffffffffffd8;
  undefined4 local_1c;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar6;
  
  AVar2 = Value::size(in_stack_ffffffffffffffd8);
  uVar6 = CONCAT13(*(uint *)(in_RDI + 0x48) <= AVar2 * 3,(int3)in_stack_ffffffffffffffe8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x201945);
  local_1c = 0;
  do {
    bVar5 = 0;
    if (local_1c < AVar2) {
      bVar5 = (byte)(uVar6 >> 0x18) ^ 0xff;
    }
    if ((bVar5 & 1) == 0) {
      if ((uVar6 & 0x1000000) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(in_RSI,CONCAT44(AVar2,uVar6));
        *(byte *)(in_RDI + 0xd8) = *(byte *)(in_RDI + 0xd8) & 0xfe | 1;
        local_2c = (AVar2 - 1) * 2 + 4;
        for (local_30 = 0; local_30 < AVar2; local_30 = local_30 + 1) {
          Value::operator[](in_stack_000001c8,in_stack_000001c4);
          bVar1 = hasCommentForValue((Value *)CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffffc6,
                                                                      CONCAT15(
                                                  in_stack_ffffffffffffffc5,
                                                  in_stack_ffffffffffffffc0))));
          if (bVar1) {
            uVar6 = 0x1000000;
          }
          Value::operator[](in_stack_000001c8,in_stack_000001c4);
          writeValue(in_stack_000001f0,in_stack_000001e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x10),(ulong)local_30);
          iVar4 = std::__cxx11::string::length();
          local_2c = iVar4 + local_2c;
        }
        *(byte *)(in_RDI + 0xd8) = *(byte *)(in_RDI + 0xd8) & 0xfe;
        bVar1 = true;
        if ((uVar6 & 0x1000000) == 0) {
          bVar1 = *(uint *)(in_RDI + 0x48) <= local_2c;
        }
        uVar6 = (uint)bVar1 << 0x18;
      }
      return (bool)((byte)(uVar6 >> 0x18) & 1);
    }
    this_00 = Value::operator[](in_stack_000001c8,in_stack_000001c4);
    bVar1 = Value::isArray(this_00);
    if (bVar1) {
LAB_002019ab:
      AVar3 = Value::size(this_00);
      in_stack_ffffffffffffffc6 = AVar3 != 0;
    }
    else {
      bVar1 = Value::isObject(this_00);
      in_stack_ffffffffffffffc6 = false;
      if (bVar1) goto LAB_002019ab;
    }
    uVar6 = CONCAT13(in_stack_ffffffffffffffc6,(int3)uVar6);
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool BuiltStyledStreamWriter::isMultineArray(Value const& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    Value const& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}